

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O1

float __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
::local_compute_reduced_cost<baryonyx::bit_array>
          (solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
           *this,int variable,bit_array *x)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_register_00001304 [12];
  undefined1 local_28 [16];
  
  sparse_matrix<int>::column((sparse_matrix<int> *)local_28,(int)this + 0x10);
  if (local_28._8_8_ == local_28._0_8_) {
    auVar1 = ZEXT864(0);
  }
  else {
    auVar1 = ZEXT864(0);
    auVar2._8_4_ = 0x7fffffff;
    auVar2._0_8_ = 0x7fffffff7fffffff;
    auVar2._12_4_ = 0x7fffffff;
    do {
      auVar3._0_4_ = (float)(this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                            _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                            super__Head_base<0UL,_int_*,_false>._M_head_impl[*(int *)local_28._8_8_]
      ;
      auVar3._4_12_ = in_register_00001304;
      auVar3 = vandps_avx(auVar3,auVar2);
      auVar3 = vfmadd231ss_fma(auVar1._0_16_,auVar3,
                               ZEXT416((uint)((this->pi)._M_t.
                                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                              .super__Head_base<0UL,_float_*,_false>._M_head_impl
                                              [*(int *)(local_28._8_8_ + 4)] +
                                             (this->P)._M_t.
                                             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                             .super__Head_base<0UL,_float_*,_false>._M_head_impl
                                             [*(int *)local_28._8_8_])));
      auVar1 = ZEXT1664(auVar3);
      local_28._8_8_ = local_28._8_8_ + 8;
    } while (local_28._8_8_ != local_28._0_8_);
  }
  return (this->c->linear_elements)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
         ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
         super__Head_base<0UL,_float_*,_false>._M_head_impl[variable] - auVar1._0_4_;
}

Assistant:

Float local_compute_reduced_cost(int variable, const Xtype& x) noexcept
    {
        Float sum_a_pi_p = 0;

        for (auto [ht, hte] = ap.column(variable); ht != hte; ++ht) {
            auto a = std::abs(static_cast<Float>(A[ht->value]));
            sum_a_pi_p += a * (pi[ht->row] + P[ht->value]);
        }

        return c(variable, x) - sum_a_pi_p;
    }